

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void bk_lib::detail::fill<Clasp::Asp::LogicProgram::DomRule>
               (DomRule *first,DomRule *last,DomRule *x)

{
  Id_t IVar1;
  uint16 uVar2;
  uint uVar3;
  DomRule *x_local;
  DomRule *last_local;
  DomRule *first_local;
  
  last_local._0_4_ = (int)last;
  first_local._0_4_ = (int)first;
  uVar3 = (int)last_local - (int)first_local;
  first_local = first;
  switch((uVar3 >> 2) * -0x55555555 & 7) {
  case 0:
    first_local = first;
    while (first_local != last) {
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
switchD_00193f38_caseD_7:
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
switchD_00193f38_caseD_6:
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
switchD_00193f38_caseD_5:
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
switchD_00193f38_caseD_4:
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
switchD_00193f38_caseD_3:
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
switchD_00193f38_caseD_2:
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
switchD_00193f38_caseD_1:
      IVar1 = x->cond;
      *(undefined4 *)&first_local->field_0x0 = *(undefined4 *)&x->field_0x0;
      first_local->cond = IVar1;
      uVar2 = x->prio;
      first_local->bias = x->bias;
      first_local->prio = uVar2;
      first_local = first_local + 1;
    }
    break;
  case 1:
    goto switchD_00193f38_caseD_1;
  case 2:
    goto switchD_00193f38_caseD_2;
  case 3:
    goto switchD_00193f38_caseD_3;
  case 4:
    goto switchD_00193f38_caseD_4;
  case 5:
    goto switchD_00193f38_caseD_5;
  case 6:
    goto switchD_00193f38_caseD_6;
  case 7:
    goto switchD_00193f38_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}